

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest11::testDraw
          (FunctionalTest11 *this,GLuint *routine_configuration,GLuint *sampler_configuration,
          GLubyte *expected_color,texture *color_texture)

{
  value_type vVar1;
  GLuint GVar2;
  GLuint GVar3;
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  reference pvVar8;
  bool bVar9;
  bool bVar10;
  uint uStack_a0;
  bool is_as_expected;
  GLuint point_offset;
  GLuint x;
  GLuint line_offset;
  GLuint y;
  undefined1 local_88 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> captured_data;
  GLuint routine;
  GLuint location_1;
  GLuint i_1;
  GLuint texture;
  GLuint location;
  GLuint i;
  GLuint subroutine_indices [5];
  Functions *gl;
  texture *color_texture_local;
  GLubyte *expected_color_local;
  GLuint *sampler_configuration_local;
  GLuint *routine_configuration_local;
  FunctionalTest11 *this_local;
  
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar7->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar4);
  for (texture = 0; texture < 2; texture = texture + 1) {
    GVar2 = this->m_uniform_locations[texture];
    GVar3 = this->m_source_textures[sampler_configuration[texture]];
    (**(code **)(stack0xffffffffffffffc0 + 8))(texture + 0x84c0);
    dVar5 = (**(code **)(stack0xffffffffffffffc0 + 0x800))();
    glu::checkError(dVar5,"ActiveTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1698);
    (**(code **)(stack0xffffffffffffffc0 + 0xb8))(0xde1,GVar3);
    dVar5 = (**(code **)(stack0xffffffffffffffc0 + 0x800))();
    glu::checkError(dVar5,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x169b);
    (**(code **)(stack0xffffffffffffffc0 + 0x14f0))(GVar2,texture);
    dVar5 = (**(code **)(stack0xffffffffffffffc0 + 0x800))();
    glu::checkError(dVar5,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x169e);
  }
  (**(code **)(stack0xffffffffffffffc0 + 8))(0x84c0);
  for (routine = 0; routine < 5; routine = routine + 1) {
    captured_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = this->m_subroutine_uniform_locations[routine];
    captured_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = routine_configuration[routine];
    (&location)
    [captured_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage._4_4_] =
         this->m_subroutine_indices[routine]
         [(uint)captured_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage];
  }
  (**(code **)(stack0xffffffffffffffc0 + 0x1668))(0x8b30,5,&location);
  dVar5 = (**(code **)(stack0xffffffffffffffc0 + 0x800))();
  glu::checkError(dVar5,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x16ad);
  (**(code **)(stack0xffffffffffffffc0 + 0x538))(0,0,1);
  dVar5 = (**(code **)(stack0xffffffffffffffc0 + 0x800))();
  glu::checkError(dVar5,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x16b1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,0x1000);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,0);
  Utils::texture::get(color_texture,0x1908,0x1401,pvVar8);
  x = 0;
  do {
    if (0x1f < x) {
      this_local._7_1_ = true;
LAB_010126b4:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
      return this_local._7_1_;
    }
    for (uStack_a0 = 0; uStack_a0 < 0x20; uStack_a0 = uStack_a0 + 1) {
      uVar6 = uStack_a0 * 4 + x * 0x80;
      vVar1 = *expected_color;
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,
                          (ulong)uVar6);
      bVar9 = false;
      if (vVar1 == *pvVar8) {
        vVar1 = expected_color[1];
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,
                            (ulong)(uVar6 + 1));
        bVar9 = vVar1 == *pvVar8;
      }
      bVar10 = false;
      if (bVar9) {
        vVar1 = expected_color[2];
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,
                            (ulong)(uVar6 + 2));
        bVar10 = vVar1 == *pvVar8;
      }
      bVar9 = false;
      if (bVar10) {
        vVar1 = expected_color[3];
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,
                            (ulong)(uVar6 + 3));
        bVar9 = vVar1 == *pvVar8;
      }
      if (!bVar9) {
        this_local._7_1_ = false;
        goto LAB_010126b4;
      }
    }
    x = x + 1;
  } while( true );
}

Assistant:

bool FunctionalTest11::testDraw(const glw::GLuint routine_configuration[5], const glw::GLuint sampler_configuration[2],
								const glw::GLubyte expected_color[4], Utils::texture& color_texture) const
{
	const glw::Functions& gl					= m_context.getRenderContext().getFunctions();
	static const GLint	n_samplers			= 2;
	static const GLint	n_subroutine_uniforms = 5;
	GLuint				  subroutine_indices[5];

	/* Set samplers */
	for (GLuint i = 0; i < n_samplers; ++i)
	{
		const GLuint location = m_uniform_locations[i];
		const GLuint texture  = m_source_textures[sampler_configuration[i]];

		gl.activeTexture(GL_TEXTURE0 + i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

		gl.bindTexture(GL_TEXTURE_2D, texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.uniform1i(location, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");
	}

	gl.activeTexture(GL_TEXTURE0 + 0);

	/* Set subroutine uniforms */
	for (GLuint i = 0; i < n_subroutine_uniforms; ++i)
	{
		const GLuint location = m_subroutine_uniform_locations[i];
		const GLuint routine  = routine_configuration[i];

		subroutine_indices[location] = m_subroutine_indices[i][routine];
	}

	gl.uniformSubroutinesuiv(GL_FRAGMENT_SHADER, 5, subroutine_indices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Draw */
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Capture result */
	std::vector<GLubyte> captured_data;
	captured_data.resize(m_texture_width * m_texture_height * 4);

	color_texture.get(GL_RGBA, GL_UNSIGNED_BYTE, &captured_data[0]);

	/* Verify result */
	for (GLuint y = 0; y < m_texture_height; ++y)
	{
		const GLuint line_offset = y * m_texture_width * 4;

		for (GLuint x = 0; x < m_texture_width; ++x)
		{
			const GLuint point_offset   = x * 4 + line_offset;
			bool		 is_as_expected = true;

			is_as_expected = is_as_expected && (expected_color[0] == captured_data[point_offset + 0]); /* red */
			is_as_expected = is_as_expected && (expected_color[1] == captured_data[point_offset + 1]); /* green */
			is_as_expected = is_as_expected && (expected_color[2] == captured_data[point_offset + 2]); /* blue */
			is_as_expected = is_as_expected && (expected_color[3] == captured_data[point_offset + 3]); /* alpha */

			if (false == is_as_expected)
			{
				return false;
			}
		}
	}

	/* Done */
	return true;
}